

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

bool __thiscall
wasm::DAE::refineArgumentTypes
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module,DAEFunctionInfo *info)

{
  pointer ppCVar1;
  bool bVar2;
  size_t __n;
  Expression **ppEVar3;
  pointer pLVar4;
  LUBFinder *this_00;
  uint index;
  ulong index_00;
  pointer ppCVar5;
  Signature SVar6;
  undefined1 local_98 [8];
  vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> lubs;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParamTypes;
  value_type local_38;
  Type newParams;
  
  if (((module->features).features & 0x400) == 0) {
    bVar2 = false;
  }
  else {
    __n = Function::getNumParams(func);
    auStack_58 = (undefined1  [8])0x0;
    newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,__n);
    std::vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::vector
              ((vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *)local_98,__n,
               (allocator_type *)&local_38);
    index = 0;
    while( true ) {
      index_00 = (ulong)index;
      if (__n <= index_00) break;
      local_38.id = (uintptr_t)Function::getLocalType(func,index);
      if (((local_38.id & 1) != 0 || local_38.id < 7) ||
         (bVar2 = SortedVector::has(&info->unusedParams,index), bVar2)) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,&local_38);
      }
      else {
        this_00 = (LUBFinder *)((long)local_98 + index_00 * 8);
        ppCVar5 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppCVar1 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          if (ppCVar5 == ppCVar1) {
            pLVar4 = (pointer)(this_00->lub).id;
            break;
          }
          ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&((*ppCVar5)->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,index_00);
          LUBFinder::note(this_00,(Type)((*ppEVar3)->type).id);
          pLVar4 = (pointer)(this_00->lub).id;
          ppCVar5 = ppCVar5 + 1;
        } while (pLVar4 != (pointer)local_38.id);
        if (pLVar4 == (pointer)0x1) {
          bVar2 = false;
          goto LAB_009c4350;
        }
        lubs.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pLVar4;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                   (Type *)&lubs.
                            super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      index = index + 1;
    }
    wasm::Type::Type(&local_38,(Tuple *)auStack_58);
    SVar6 = HeapType::getSignature(&func->type);
    bVar2 = local_38.id != SVar6.params.id.id;
    if (bVar2) {
      TypeUpdating::updateParamTypes
                (func,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,module,Update);
      Function::setParams(func,(Type)local_38.id);
    }
LAB_009c4350:
    std::_Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::~_Vector_base
              ((_Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *)local_98);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
  }
  return bVar2;
}

Assistant:

bool refineArgumentTypes(Function* func,
                           const std::vector<Call*>& calls,
                           Module* module,
                           const DAEFunctionInfo& info) {
    if (!module->features.hasGC()) {
      return false;
    }
    auto numParams = func->getNumParams();
    std::vector<Type> newParamTypes;
    newParamTypes.reserve(numParams);
    std::vector<LUBFinder> lubs(numParams);
    for (Index i = 0; i < numParams; i++) {
      auto originalType = func->getLocalType(i);
      // If the parameter type is not a reference, there is nothing to refine.
      // And if it is unused, also do nothing, as we can leave it to the other
      // parts of this pass to optimize it properly, which avoids having to
      // think about corner cases involving refining the type of an unused
      // param (in particular, unused params are turned into locals, which means
      // we'd need to think about defaultability etc.).
      if (!originalType.isRef() || info.unusedParams.has(i)) {
        newParamTypes.push_back(originalType);
        continue;
      }
      auto& lub = lubs[i];
      for (auto* call : calls) {
        auto* operand = call->operands[i];
        lub.note(operand->type);
        if (lub.getLUB() == originalType) {
          // We failed to refine this parameter to anything more specific.
          break;
        }
      }

      // Nothing is sent here at all; leave such optimizations to DCE.
      if (!lub.noted()) {
        return false;
      }
      newParamTypes.push_back(lub.getLUB());
    }

    // Check if we are able to optimize here before we do the work to scan the
    // function body.
    auto newParams = Type(newParamTypes);
    if (newParams == func->getParams()) {
      return false;
    }

    // We can do this!
    TypeUpdating::updateParamTypes(func, newParamTypes, *module);

    // Update the function's type.
    func->setParams(newParams);

    return true;
  }